

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureViewTestGetTexParameter::iterate(TextureViewTestGetTexParameter *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestError *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  float fVar8;
  MessageBuilder local_fc8;
  MessageBuilder local_e48;
  MessageBuilder local_cc8;
  MessageBuilder local_b48;
  MessageBuilder local_9c8;
  MessageBuilder local_848;
  MessageBuilder local_6c8;
  MessageBuilder local_548;
  MessageBuilder local_3c8;
  MessageBuilder local_248;
  undefined4 local_c8;
  GLuint local_c4;
  float epsilon;
  GLint texture_object_id;
  _test_run *test_run;
  GLint query_texture_view_num_levels_value_int;
  GLfloat query_texture_view_num_levels_value_float;
  GLint query_texture_view_num_layers_value_int;
  GLfloat query_texture_view_num_layers_value_float;
  GLint query_texture_view_min_level_value_int;
  GLfloat query_texture_view_min_level_value_float;
  GLint query_texture_view_min_layer_value_int;
  GLfloat query_texture_view_min_layer_value_float;
  GLint query_texture_immutable_levels_value_int;
  GLfloat query_texture_immutable_levels_value_float;
  __normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
  local_88;
  __normal_iterator<const_gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
  local_80;
  _test_runs_const_iterator test_run_iterator;
  allocator<char> local_61;
  string local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions;
  Functions *gl;
  TextureViewTestGetTexParameter *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  extensions = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_20 = glu::ContextInfo::getExtensions_abi_cxx11_(this_00);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(local_20);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_20);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                       (local_30,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_38,(char (*) [20])"GL_ARB_texture_view");
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_20);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
  if (bVar1) {
    test_run_iterator._M_current._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"GL_ARB_texture_view is not supported",&local_61);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_60);
    test_run_iterator._M_current._3_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTestRuns(this);
  local_88._M_current =
       (_test_run *)
       std::
       vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
       ::begin(&this->m_test_runs);
  __gnu_cxx::
  __normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_const*,std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>>
  ::__normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run*>
            ((__normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_const*,std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>>
              *)&local_80,&local_88);
  while( true ) {
    _query_texture_immutable_levels_value_int =
         std::
         vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
         ::end(&this->m_test_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
                        *)&query_texture_immutable_levels_value_int);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    query_texture_view_min_layer_value_float = -1.0;
    query_texture_view_min_layer_value_int = -1;
    query_texture_view_min_level_value_float = -1.0;
    query_texture_view_min_level_value_int = -1;
    query_texture_view_num_layers_value_float = -1.0;
    query_texture_view_num_layers_value_int = -1;
    query_texture_view_num_levels_value_float = -1.0;
    query_texture_view_num_levels_value_int = -1;
    test_run._4_4_ = -1.0;
    test_run._0_4_ = -1;
    _epsilon = __gnu_cxx::
               __normal_iterator<const_gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
               ::operator*(&local_80);
    local_c4 = 0;
    switch(_epsilon->texture_type) {
    case TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED:
      local_c4 = _epsilon->parent_texture_object_id;
      break;
    case TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT:
      local_c4 = _epsilon->parent_texture_object_id;
      break;
    case TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT:
      local_c4 = _epsilon->parent_texture_object_id;
      break;
    case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT:
      local_c4 = _epsilon->texture_view_object_created_from_immutable_to_id;
      break;
    case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW:
      local_c4 = _epsilon->texture_view_object_created_from_view_to_id;
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized texture type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc0e);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(code *)extensions[7].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(_epsilon->texture_target,local_c4)
    ;
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glBindTexture() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc14);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)
              (_epsilon->texture_target,0x82df,&query_texture_view_min_layer_value_float);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameterfv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc19);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)
              (_epsilon->texture_target,0x82df,&query_texture_view_min_layer_value_int);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexPrameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc1d);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)
              (_epsilon->texture_target,0x82dd,&query_texture_view_min_level_value_float);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc21);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)
              (_epsilon->texture_target,0x82dd,&query_texture_view_min_level_value_int);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc25);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)
              (_epsilon->texture_target,0x82db,&query_texture_view_num_layers_value_float);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc29);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)
              (_epsilon->texture_target,0x82db,&query_texture_view_num_layers_value_int);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc2d);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)
              (_epsilon->texture_target,0x82de,&query_texture_view_num_levels_value_float);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc31);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)
              (_epsilon->texture_target,0x82de,&query_texture_view_num_levels_value_int);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc35);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)
              (_epsilon->texture_target,0x82dc,(long)&test_run + 4);
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc39);
    (*(code *)extensions[0x73].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)(_epsilon->texture_target,0x82dc,&test_run)
    ;
    dVar3 = (*(code *)extensions[0x55].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar3,"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0xc3d);
    local_c8 = 0x3727c5ac;
    fVar8 = de::abs<float>(query_texture_view_min_layer_value_float -
                           (float)_epsilon->expected_n_immutable_levels);
    if (1e-05 < fVar8) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_248,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_248,
                          (char (*) [77])
                          "Invalid floating-point value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_immutable_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_min_layer_value_float);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_248);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc4a);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (query_texture_view_min_layer_value_int != _epsilon->expected_n_immutable_levels) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_3c8,
                          (char (*) [70])
                          "Invalid integer value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_immutable_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_min_layer_value_int);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc55);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    fVar8 = de::abs<float>(query_texture_view_min_level_value_float -
                           (float)_epsilon->expected_n_min_layer);
    if (1e-05 < fVar8) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_548,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_548,
                          (char (*) [75])
                          "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LAYER pname "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_min_layer);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_min_level_value_float);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_548);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc60);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (query_texture_view_min_level_value_int != _epsilon->expected_n_min_layer) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_6c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_6c8,
                          (char (*) [68])
                          "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LAYER pname ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_min_layer);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_min_level_value_int);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc6b);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    fVar8 = de::abs<float>(query_texture_view_num_layers_value_float -
                           (float)_epsilon->expected_n_min_level);
    if (1e-05 < fVar8) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_848,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_848,
                          (char (*) [75])
                          "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_min_level);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_num_layers_value_float);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_848);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc76);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (query_texture_view_num_layers_value_int != _epsilon->expected_n_min_level) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_9c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_9c8,
                          (char (*) [68])
                          "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_min_level);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_num_layers_value_int);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_9c8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc81);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    fVar8 = de::abs<float>(query_texture_view_num_levels_value_float -
                           (float)_epsilon->expected_n_num_layers);
    if (1e-05 < fVar8) break;
    if (query_texture_view_num_levels_value_int != _epsilon->expected_n_num_layers) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_cc8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_cc8,
                          (char (*) [69])
                          "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_num_layers);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_num_levels_value_int);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_cc8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xc97);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    fVar8 = de::abs<float>(test_run._4_4_ - (float)_epsilon->expected_n_num_levels);
    if (1e-05 < fVar8) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_e48,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_e48,
                          (char (*) [76])
                          "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_num_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)((long)&test_run + 4));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_e48);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xca2);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if ((int)test_run != _epsilon->expected_n_num_levels) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_fc8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_fc8,
                          (char (*) [69])
                          "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_num_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&test_run);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_fc8);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0xcad);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
    ::operator++(&local_80,0);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_b48,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_b48,
                      (char (*) [76])
                      "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname ")
  ;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])"(expected: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&_epsilon->expected_n_num_layers);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2ae989d);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&query_texture_view_num_levels_value_float);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c23dab);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b48);
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0xc8c);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestGetTexParameter::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure GL_ARB_texture_view is reported as supported before carrying on
	 * with actual execution */
	const std::vector<std::string>& extensions = m_context.getContextInfo().getExtensions();

	if (std::find(extensions.begin(), extensions.end(), "GL_ARB_texture_view") == extensions.end())
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all objects necessary to execute the test */
	initTestRuns();

	/* Iterate through all test runs and issue the queries */
	for (_test_runs_const_iterator test_run_iterator = m_test_runs.begin(); test_run_iterator != m_test_runs.end();
		 test_run_iterator++)
	{
		glw::GLfloat	 query_texture_immutable_levels_value_float = -1.0f;
		glw::GLint		 query_texture_immutable_levels_value_int   = -1;
		glw::GLfloat	 query_texture_view_min_layer_value_float   = -1.0f;
		glw::GLint		 query_texture_view_min_layer_value_int		= -1;
		glw::GLfloat	 query_texture_view_min_level_value_float   = -1.0f;
		glw::GLint		 query_texture_view_min_level_value_int		= -1;
		glw::GLfloat	 query_texture_view_num_layers_value_float  = -1.0f;
		glw::GLint		 query_texture_view_num_layers_value_int	= -1;
		glw::GLfloat	 query_texture_view_num_levels_value_float  = -1.0f;
		glw::GLint		 query_texture_view_num_levels_value_int	= -1;
		const _test_run& test_run									= *test_run_iterator;
		glw::GLint		 texture_object_id							= 0;

		switch (test_run.texture_type)
		{
		case TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED:
			texture_object_id = test_run.parent_texture_object_id;
			break;
		case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT:
			texture_object_id = test_run.texture_view_object_created_from_immutable_to_id;
			break;
		case TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW:
			texture_object_id = test_run.texture_view_object_created_from_view_to_id;
			break;

		default:
		{
			TCU_FAIL("Unrecognized texture type");
		}
		}

		/* Bind the texture object of our interest to the target */
		gl.bindTexture(test_run.texture_target, texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

		/* Run all the queries */
		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_IMMUTABLE_LEVELS,
							 &query_texture_immutable_levels_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_IMMUTABLE_LEVELS,
							 &query_texture_immutable_levels_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexPrameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LAYER,
							 &query_texture_view_min_layer_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LAYER,
							 &query_texture_view_min_layer_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LEVEL,
							 &query_texture_view_min_level_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_MIN_LEVEL,
							 &query_texture_view_min_level_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LAYERS,
							 &query_texture_view_num_layers_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LAYERS,
							 &query_texture_view_num_layers_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname");

		gl.getTexParameterfv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LEVELS,
							 &query_texture_view_num_levels_value_float);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameterfv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname");

		gl.getTexParameteriv(test_run.texture_target, GL_TEXTURE_VIEW_NUM_LEVELS,
							 &query_texture_view_num_levels_value_int);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname");

		/* Verify the results */
		const float epsilon = 1e-5f;

		if (de::abs(query_texture_immutable_levels_value_float - (float)test_run.expected_n_immutable_levels) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
							   << "(expected: " << test_run.expected_n_immutable_levels
							   << " found: " << query_texture_immutable_levels_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname");
		}

		if (query_texture_immutable_levels_value_int != test_run.expected_n_immutable_levels)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname "
							   << "(expected: " << test_run.expected_n_immutable_levels
							   << " found: " << query_texture_immutable_levels_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_IMMUTABLE_LEVELS pname");
		}

		if (de::abs(query_texture_view_min_layer_value_float - (float)test_run.expected_n_min_layer) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LAYER pname "
							   << "(expected: " << test_run.expected_n_min_layer
							   << " found: " << query_texture_view_min_layer_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname");
		}

		if (query_texture_view_min_layer_value_int != test_run.expected_n_min_layer)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LAYER pname "
							   << "(expected: " << test_run.expected_n_min_layer
							   << " found: " << query_texture_view_min_layer_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LAYER pname");
		}

		if (de::abs(query_texture_view_min_level_value_float - (float)test_run.expected_n_min_level) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname "
							   << "(expected: " << test_run.expected_n_min_level
							   << " found: " << query_texture_view_min_level_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname");
		}

		if (query_texture_view_min_level_value_int != test_run.expected_n_min_level)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname "
							   << "(expected: " << test_run.expected_n_min_level
							   << " found: " << query_texture_view_min_level_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_MIN_LEVEL pname");
		}

		if (de::abs(query_texture_view_num_layers_value_float - (float)test_run.expected_n_num_layers) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname "
							   << "(expected: " << test_run.expected_n_num_layers
							   << " found: " << query_texture_view_num_layers_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname");
		}

		if (query_texture_view_num_layers_value_int != test_run.expected_n_num_layers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname "
							   << "(expected: " << test_run.expected_n_num_layers
							   << " found: " << query_texture_view_num_layers_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LAYERS pname");
		}

		if (de::abs(query_texture_view_num_levels_value_float - (float)test_run.expected_n_num_levels) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid floating-point value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname "
							   << "(expected: " << test_run.expected_n_num_levels
							   << " found: " << query_texture_view_num_levels_value_float << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname");
		}

		if (query_texture_view_num_levels_value_int != test_run.expected_n_num_levels)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid integer value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname "
							   << "(expected: " << test_run.expected_n_num_levels
							   << " found: " << query_texture_view_num_levels_value_int << ")."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid FP value reported for GL_TEXTURE_VIEW_NUM_LEVELS pname");
		}
	} /* for (all test runs) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}